

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pDrawCallBatchingTests.cpp
# Opt level: O0

deUint64 __thiscall
deqp::gles2::Performance::anon_unknown_0::DrawCallBatchingTest::renderUnbatched
          (DrawCallBatchingTest *this)

{
  value_type vVar1;
  code *pcVar2;
  int iVar3;
  deUint32 dVar4;
  undefined4 uVar5;
  value_type_conflict1 vVar6;
  undefined4 extraout_var;
  undefined8 uVar8;
  reference pvVar9;
  reference pvVar10;
  reference pvVar11;
  deUint64 dVar12;
  reference this_00;
  reference pvVar13;
  reference pvVar14;
  int local_134;
  undefined1 local_130 [4];
  int attribNdx_4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  undefined4 local_f0;
  int local_ec;
  GLint location_2;
  int attribNdx_3;
  int attribNdx_2;
  int drawNdx;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  value_type_conflict1 local_a0;
  int local_9c;
  GLint location_1;
  int attribNdx_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  undefined4 local_54;
  int local_50;
  GLint location;
  int attribNdx;
  undefined1 local_40 [8];
  vector<int,_std::allocator<int>_> dynamicAttributeLocations;
  deUint64 endUs;
  deUint64 beginUs;
  Functions *gl;
  DrawCallBatchingTest *this_local;
  long lVar7;
  
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar3);
  dynamicAttributeLocations.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_40);
  (**(code **)(lVar7 + 0x1a00))(0,0,0x20);
  pcVar2 = *(code **)(lVar7 + 0x1680);
  dVar4 = glu::ShaderProgram::getProgram(this->m_program);
  (*pcVar2)(dVar4);
  for (local_50 = 0; local_50 < (this->m_spec).staticAttributeCount; local_50 = local_50 + 1) {
    pcVar2 = *(code **)(lVar7 + 0x780);
    dVar4 = glu::ShaderProgram::getProgram(this->m_program);
    de::toString<int>((string *)&location_1,&local_50);
    std::operator+(&local_78,"a_static",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&location_1)
    ;
    uVar8 = std::__cxx11::string::c_str();
    uVar5 = (*pcVar2)(dVar4,uVar8);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&location_1);
    local_54 = uVar5;
    (**(code **)(lVar7 + 0x610))(uVar5);
    uVar5 = local_54;
    if (((this->m_spec).useStaticBuffer & 1U) == 0) {
      pcVar2 = *(code **)(lVar7 + 0x19f0);
      pvVar10 = std::
                vector<std::vector<signed_char,_std::allocator<signed_char>_>,_std::allocator<std::vector<signed_char,_std::allocator<signed_char>_>_>_>
                ::operator[](&this->m_staticAttributeDatas,(long)local_50);
      pvVar11 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[](pvVar10,0);
      (*pcVar2)(uVar5,4,0x1400,1,0,pvVar11);
    }
    else {
      pcVar2 = *(code **)(lVar7 + 0x40);
      pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&this->m_unbatchedStaticBuffers,(long)local_50);
      (*pcVar2)(0x8892,*pvVar9);
      (**(code **)(lVar7 + 0x19f0))(local_54,4,0x1400,1,0,0);
      (**(code **)(lVar7 + 0x40))(0x8892,0);
    }
  }
  for (local_9c = 0; local_9c < (this->m_spec).dynamicAttributeCount; local_9c = local_9c + 1) {
    pcVar2 = *(code **)(lVar7 + 0x780);
    dVar4 = glu::ShaderProgram::getProgram(this->m_program);
    de::toString<int>((string *)&attribNdx_2,&local_9c);
    std::operator+(&local_c0,"a_dyn",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&attribNdx_2
                  );
    uVar8 = std::__cxx11::string::c_str();
    vVar6 = (*pcVar2)(dVar4,uVar8);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&attribNdx_2);
    local_a0 = vVar6;
    (**(code **)(lVar7 + 0x610))(vVar6);
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)local_40,&local_a0);
  }
  if (((((this->m_spec).useDrawElements & 1U) != 0) && (((this->m_spec).useIndexBuffer & 1U) != 0))
     && (((this->m_spec).dynamicIndices & 1U) == 0)) {
    (**(code **)(lVar7 + 0x40))(0x8893,this->m_unbatchedStaticIndexBuffer);
  }
  dVar4 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar4,"Failed to setup initial state for rendering.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/performance/es2pDrawCallBatchingTests.cpp"
                  ,0x268);
  (**(code **)(lVar7 + 0x648))();
  dVar12 = deGetMicroseconds();
  for (attribNdx_3 = 0; attribNdx_3 < (this->m_spec).drawCallCount; attribNdx_3 = attribNdx_3 + 1) {
    for (location_2 = 0; location_2 < (this->m_spec).dynamicAttributeCount;
        location_2 = location_2 + 1) {
      if (((this->m_spec).useDynamicBuffer & 1U) == 0) {
        pcVar2 = *(code **)(lVar7 + 0x19f0);
        pvVar13 = std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)local_40,(long)location_2);
        vVar1 = *pvVar13;
        pvVar10 = std::
                  vector<std::vector<signed_char,_std::allocator<signed_char>_>,_std::allocator<std::vector<signed_char,_std::allocator<signed_char>_>_>_>
                  ::operator[](&this->m_dynamicAttributeDatas,(long)location_2);
        pvVar11 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                            (pvVar10,(long)((this->m_spec).triangleCount * attribNdx_3 * 0xc));
        (*pcVar2)(vVar1,4,0x1400,1,0,pvVar11);
      }
      else {
        pcVar2 = *(code **)(lVar7 + 0x40);
        this_00 = std::
                  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ::operator[](&this->m_unbatchedDynamicBuffers,(long)location_2);
        pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (this_00,(long)attribNdx_3);
        (*pcVar2)(0x8892,*pvVar9);
        pcVar2 = *(code **)(lVar7 + 0x19f0);
        pvVar13 = std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)local_40,(long)location_2);
        (*pcVar2)(*pvVar13,4,0x1400,1,0,0);
        (**(code **)(lVar7 + 0x40))(0x8892);
      }
    }
    if (((this->m_spec).useDrawElements & 1U) == 0) {
      (**(code **)(lVar7 + 0x538))(4,0,(this->m_spec).triangleCount * 3);
    }
    else if (((this->m_spec).useIndexBuffer & 1U) == 0) {
      if (((this->m_spec).dynamicIndices & 1U) == 0) {
        pcVar2 = *(code **)(lVar7 + 0x568);
        iVar3 = (this->m_spec).triangleCount;
        pvVar14 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                            (&this->m_staticIndexData,0);
        (*pcVar2)(4,iVar3 * 3,0x1401,pvVar14);
      }
      else {
        pcVar2 = *(code **)(lVar7 + 0x568);
        iVar3 = (this->m_spec).triangleCount * 3;
        pvVar14 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                            (&this->m_dynamicIndexData,(long)(iVar3 * attribNdx_3));
        (*pcVar2)(4,iVar3,0x1401,pvVar14);
      }
    }
    else if (((this->m_spec).dynamicIndices & 1U) == 0) {
      (**(code **)(lVar7 + 0x568))(4,(this->m_spec).triangleCount * 3,0x1401,0);
    }
    else {
      pcVar2 = *(code **)(lVar7 + 0x40);
      pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&this->m_unbatchedDynamicIndexBuffers,(long)attribNdx_3);
      (*pcVar2)(0x8893,*pvVar9);
      (**(code **)(lVar7 + 0x568))(4,(this->m_spec).triangleCount * 3,0x1401,0);
      (**(code **)(lVar7 + 0x40))(0x8893);
    }
  }
  (**(code **)(lVar7 + 0x648))();
  dynamicAttributeLocations.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)deGetMicroseconds();
  dVar4 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar4,"Unbatched rendering failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/performance/es2pDrawCallBatchingTests.cpp"
                  ,0x299);
  (**(code **)(lVar7 + 0x40))(0x8893,0);
  for (local_ec = 0; local_ec < (this->m_spec).staticAttributeCount; local_ec = local_ec + 1) {
    pcVar2 = *(code **)(lVar7 + 0x780);
    dVar4 = glu::ShaderProgram::getProgram(this->m_program);
    de::toString<int>((string *)local_130,&local_ec);
    std::operator+(&local_110,"a_static",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_130);
    uVar8 = std::__cxx11::string::c_str();
    uVar5 = (*pcVar2)(dVar4,uVar8);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)local_130);
    local_f0 = uVar5;
    (**(code **)(lVar7 + 0x518))(uVar5);
  }
  for (local_134 = 0; local_134 < (this->m_spec).dynamicAttributeCount; local_134 = local_134 + 1) {
    pcVar2 = *(code **)(lVar7 + 0x518);
    pvVar13 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)local_40,(long)local_134);
    (*pcVar2)(*pvVar13);
  }
  dVar4 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar4,"Failed to reset state after unbatched rendering",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/performance/es2pDrawCallBatchingTests.cpp"
                  ,0x2a6);
  dVar12 = (long)dynamicAttributeLocations.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage - dVar12;
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_40);
  return dVar12;
}

Assistant:

deUint64 DrawCallBatchingTest::renderUnbatched (void)
{
	const glw::Functions&	gl		= m_renderCtx.getFunctions();
	deUint64				beginUs	= 0;
	deUint64				endUs	= 0;
	vector<GLint>			dynamicAttributeLocations;

	gl.viewport(0, 0, 32, 32);
	gl.useProgram(m_program->getProgram());

	// Setup static buffers
	for (int attribNdx = 0; attribNdx < m_spec.staticAttributeCount; attribNdx++)
	{
		GLint location = gl.getAttribLocation(m_program->getProgram(), ("a_static" + de::toString(attribNdx)).c_str());

		gl.enableVertexAttribArray(location);

		if (m_spec.useStaticBuffer)
		{
			gl.bindBuffer(GL_ARRAY_BUFFER, m_unbatchedStaticBuffers[attribNdx]);
			gl.vertexAttribPointer(location, 4, GL_BYTE, GL_TRUE, 0, NULL);
			gl.bindBuffer(GL_ARRAY_BUFFER, 0);
		}
		else
			gl.vertexAttribPointer(location, 4, GL_BYTE, GL_TRUE, 0, &(m_staticAttributeDatas[attribNdx][0]));
	}

	// Get locations of dynamic attributes
	for (int attribNdx = 0; attribNdx < m_spec.dynamicAttributeCount; attribNdx++)
	{
		GLint location = gl.getAttribLocation(m_program->getProgram(), ("a_dyn" + de::toString(attribNdx)).c_str());

		gl.enableVertexAttribArray(location);
		dynamicAttributeLocations.push_back(location);
	}

	if (m_spec.useDrawElements && m_spec.useIndexBuffer && !m_spec.dynamicIndices)
		gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, m_unbatchedStaticIndexBuffer);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to setup initial state for rendering.");

	gl.finish();

	beginUs = deGetMicroseconds();

	for (int drawNdx = 0; drawNdx < m_spec.drawCallCount; drawNdx++)
	{
		for (int attribNdx = 0; attribNdx < m_spec.dynamicAttributeCount; attribNdx++)
		{
			if (m_spec.useDynamicBuffer)
			{
				gl.bindBuffer(GL_ARRAY_BUFFER, m_unbatchedDynamicBuffers[attribNdx][drawNdx]);
				gl.vertexAttribPointer(dynamicAttributeLocations[attribNdx], 4, GL_BYTE, GL_TRUE, 0, NULL);
				gl.bindBuffer(GL_ARRAY_BUFFER, 0);
			}
			else
				gl.vertexAttribPointer(dynamicAttributeLocations[attribNdx], 4, GL_BYTE, GL_TRUE, 0, &(m_dynamicAttributeDatas[attribNdx][m_spec.triangleCount * 3 * drawNdx * 4]));
		}

		if (m_spec.useDrawElements)
		{
			if (m_spec.useIndexBuffer)
			{
				if (m_spec.dynamicIndices)
				{
					gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, m_unbatchedDynamicIndexBuffers[drawNdx]);
					gl.drawElements(GL_TRIANGLES, m_spec.triangleCount * 3, GL_UNSIGNED_BYTE, NULL);
					gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, 0);
				}
				else
					gl.drawElements(GL_TRIANGLES, m_spec.triangleCount * 3, GL_UNSIGNED_BYTE, NULL);
			}
			else
			{
				if (m_spec.dynamicIndices)
					gl.drawElements(GL_TRIANGLES, m_spec.triangleCount * 3, GL_UNSIGNED_BYTE, &(m_dynamicIndexData[drawNdx * m_spec.triangleCount * 3]));
				else
					gl.drawElements(GL_TRIANGLES, m_spec.triangleCount * 3, GL_UNSIGNED_BYTE, &(m_staticIndexData[0]));
			}
		}
		else
			gl.drawArrays(GL_TRIANGLES, 0, 3 * m_spec.triangleCount);
	}

	gl.finish();

	endUs = deGetMicroseconds();

	GLU_EXPECT_NO_ERROR(gl.getError(), "Unbatched rendering failed");

	gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, 0);

	for (int attribNdx = 0; attribNdx < m_spec.staticAttributeCount; attribNdx++)
	{
		GLint location = gl.getAttribLocation(m_program->getProgram(), ("a_static" + de::toString(attribNdx)).c_str());
		gl.disableVertexAttribArray(location);
	}

	for (int attribNdx = 0; attribNdx < m_spec.dynamicAttributeCount; attribNdx++)
		gl.disableVertexAttribArray(dynamicAttributeLocations[attribNdx]);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to reset state after unbatched rendering");

	return endUs - beginUs;
}